

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  ulong unaff_R12;
  ulong unaff_R13;
  QPDF qpdf;
  vector<int,_std::allocator<int>_> numbers;
  QPDFOutlineDocumentHelper odh;
  QPDF aQStack_98 [12];
  uint local_8c;
  vector<int,_std::allocator<int>_> local_88;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_68 [24];
  QPDFOutlineDocumentHelper local_50;
  
  pcVar3 = (char *)QUtil::getWhoami(*argv);
  whoami = pcVar3;
  local_8c = argc;
  if (argc == 2) {
    iVar2 = strcmp(argv[1],"--version");
    if (iVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,pcVar3);
      poVar4 = std::operator<<(poVar4," version 1.5");
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(0);
    }
  }
  else if (argc < 2) goto LAB_00103e23;
  unaff_R12 = (ulong)local_8c;
  unaff_R13 = 1;
  do {
    pcVar3 = argv[unaff_R13];
    if (*pcVar3 != '-') goto LAB_00103e28;
    iVar2 = strcmp(pcVar3,"--numbers");
    if (iVar2 == 0) {
      style = st_numbers;
    }
    else {
      iVar2 = strcmp(pcVar3,"--lines");
      if (iVar2 == 0) {
        style = st_lines;
      }
      else {
        iVar2 = strcmp(pcVar3,"--show-open");
        if (iVar2 == 0) {
          show_open = 1;
        }
        else {
          iVar2 = strcmp(pcVar3,"--show-targets");
          if (iVar2 != 0) break;
          show_targets = '\x01';
        }
      }
    }
    unaff_R13 = unaff_R13 + 1;
  } while (unaff_R12 != unaff_R13);
LAB_00103e23:
  do {
    usage();
LAB_00103e28:
    iVar2 = (int)unaff_R13 + 1;
    if (iVar2 < (int)local_8c) {
      iVar2 = (int)unaff_R13 + 2;
    }
  } while (iVar2 != (int)unaff_R12);
  pcVar3 = argv[unaff_R13 & 0xffffffff];
  QPDF::QPDF(aQStack_98);
  QPDF::processFile((char *)aQStack_98,pcVar3);
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(&local_50,aQStack_98);
  cVar1 = QPDFOutlineDocumentHelper::hasOutlines();
  if (cVar1 == '\0') {
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1080a0);
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," has no bookmarks",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  else {
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (show_targets == '\x01') {
      generate_page_map(aQStack_98);
    }
    QPDFOutlineDocumentHelper::getTopLevelOutlines();
    extract_bookmarks(local_68,&local_88);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              (local_68);
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper(&local_50);
  QPDF::~QPDF(aQStack_98);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if ((argc == 2) && (strcmp(argv[1], "--version") == 0)) {
        std::cout << whoami << " version 1.5" << std::endl;
        exit(0);
    }

    int arg;
    for (arg = 1; arg < argc; ++arg) {
        if (argv[arg][0] == '-') {
            if (strcmp(argv[arg], "--numbers") == 0) {
                style = st_numbers;
            } else if (strcmp(argv[arg], "--lines") == 0) {
                style = st_lines;
            } else if (strcmp(argv[arg], "--show-open") == 0) {
                show_open = true;
            } else if (strcmp(argv[arg], "--show-targets") == 0) {
                show_targets = true;
            } else {
                usage();
            }
        } else {
            break;
        }
    }

    if (arg >= argc) {
        usage();
    }

    char const* filename = argv[arg++];
    char const* password = "";

    if (arg < argc) {
        password = argv[arg++];
    }
    if (arg != argc) {
        usage();
    }

    try {
        QPDF qpdf;
        qpdf.processFile(filename, password);

        QPDFOutlineDocumentHelper odh(qpdf);
        if (odh.hasOutlines()) {
            std::vector<int> numbers;
            if (show_targets) {
                generate_page_map(qpdf);
            }
            extract_bookmarks(odh.getTopLevelOutlines(), numbers);
        } else {
            std::cout << filename << " has no bookmarks" << std::endl;
        }
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << filename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}